

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_f6f6::MovieState::parse_handler(MovieState *this)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  ostream *poVar4;
  PacketQueue<14680064UL> *in_RDI;
  SDL_Event evt;
  unique_lock<std::mutex> lock;
  AVPacket packet;
  AVCodecParameters *codecpar;
  uint i;
  int audio_index;
  int video_index;
  PacketQueue<14680064UL> *video_queue;
  PacketQueue<2097152UL> *audio_queue;
  undefined2 in_stack_fffffffffffffe68;
  byte in_stack_fffffffffffffe6a;
  uint in_stack_fffffffffffffe6b;
  undefined1 __i;
  atomic<bool> *in_stack_fffffffffffffe78;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffe80;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_fffffffffffffe88;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffea0;
  _Mem_fn<int_((anonymous_namespace)::AudioState::*)()> *in_stack_fffffffffffffea8;
  thread *in_stack_fffffffffffffeb0;
  int local_124;
  duration<long,std::ratio<1l,1000l>> local_120 [12];
  int local_114;
  AVPacket *in_stack_fffffffffffffef0;
  PacketQueue<14680064UL> *in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff04;
  MovieState *in_stack_ffffffffffffff08;
  int local_e4;
  int local_4c;
  duration<long,std::ratio<1l,1000l>> local_48 [8];
  rep local_40;
  rep local_38;
  AVCodecParameters *local_30;
  uint local_24;
  int local_20;
  int local_1c;
  iterator *local_18;
  undefined1 *local_10;
  
  local_10 = &in_RDI->field_0x40;
  local_18 = &in_RDI[3].mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
              super__Deque_impl_data._M_start;
  local_1c = -1;
  local_20 = -1;
  local_24 = 0;
  while( true ) {
    in_stack_fffffffffffffe6b = CONCAT31((int3)local_24,(char)in_stack_fffffffffffffe6b);
    __i = (undefined1)(local_24 >> 0x18);
    pAVar3 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::operator->
                       ((unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *)
                        0x11117b);
    if (pAVar3->nb_streams <= CONCAT13(__i,(int3)(in_stack_fffffffffffffe6b >> 8))) break;
    pAVar3 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::operator->
                       ((unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *)
                        0x111199);
    local_30 = pAVar3->streams[local_24]->codecpar;
    if (((local_30->codec_type == AVMEDIA_TYPE_VIDEO) &&
        (((anonymous_namespace)::DisableVideo & 1) == 0)) && (local_1c < 0)) {
      local_1c = streamComponentOpen(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    }
    else if ((local_30->codec_type == AVMEDIA_TYPE_AUDIO) && (local_20 < 0)) {
      local_20 = streamComponentOpen(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    }
    local_24 = local_24 + 1;
  }
  if ((local_1c < 0) && (local_20 < 0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             (string *)
                             &in_RDI[7].mPackets.
                              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_last);
    poVar4 = std::operator<<(poVar4,": could not open codecs");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)__i);
  }
  local_40 = (rep)get_avtime();
  local_4c = 0x2ee;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_48,&local_4c);
  local_38 = (rep)std::chrono::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  (in_RDI->mMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)local_38;
  if (-1 < local_20) {
    std::mem_fn<int(),(anonymous_namespace)::AudioState>
              ((offset_in_AudioState_to_subr)in_stack_fffffffffffffe78);
    std::thread::
    thread<std::_Mem_fn<int((anonymous_namespace)::AudioState::*)()>,(anonymous_namespace)::AudioState*,void>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (AudioState **)in_stack_fffffffffffffea0);
    std::thread::operator=
              ((thread *)in_RDI,
               (thread *)
               CONCAT17(__i,CONCAT43(in_stack_fffffffffffffe6b,
                                     CONCAT12(in_stack_fffffffffffffe6a,in_stack_fffffffffffffe68)))
              );
    std::thread::~thread((thread *)0x11139a);
  }
  if (-1 < local_1c) {
    std::mem_fn<int(),(anonymous_namespace)::VideoState>
              ((offset_in_VideoState_to_subr)in_stack_fffffffffffffe78);
    std::thread::
    thread<std::_Mem_fn<int((anonymous_namespace)::VideoState::*)()>,(anonymous_namespace)::VideoState*,void>
              (in_stack_fffffffffffffeb0,
               (_Mem_fn<int_((anonymous_namespace)::VideoState::*)()> *)in_stack_fffffffffffffea8,
               (VideoState **)in_stack_fffffffffffffea0);
    std::thread::operator=
              ((thread *)in_RDI,
               (thread *)
               CONCAT17(__i,CONCAT43(in_stack_fffffffffffffe6b,
                                     CONCAT12(in_stack_fffffffffffffe6a,in_stack_fffffffffffffe68)))
              );
    std::thread::~thread((thread *)0x111441);
  }
  while (bVar1 = std::atomic<bool>::load
                           (in_stack_fffffffffffffe78,(memory_order)((ulong)in_RDI >> 0x20)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar3 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::get
                       ((unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *)
                        in_RDI);
    iVar2 = av_read_frame(pAVar3,&stack0xfffffffffffffef8);
    if (iVar2 < 0) break;
    if (local_e4 == local_1c) {
      while( true ) {
        bVar1 = std::atomic<bool>::load
                          (in_stack_fffffffffffffe78,(memory_order)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffffe6b = in_stack_fffffffffffffe6b & 0xffffff00;
        if (!bVar1) {
          bVar1 = PacketQueue<14680064UL>::put(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          in_stack_fffffffffffffe6b = CONCAT31((int3)(in_stack_fffffffffffffe6b >> 8),bVar1) ^ 0xff;
        }
        if ((in_stack_fffffffffffffe6b & 1) == 0) break;
        local_114 = 100;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffef0,&local_114);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffffea0);
      }
    }
    else if (local_e4 == local_20) {
      while( true ) {
        bVar1 = std::atomic<bool>::load
                          (in_stack_fffffffffffffe78,(memory_order)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffffe6a = 0;
        if (!bVar1) {
          bVar1 = PacketQueue<2097152UL>::put
                            ((PacketQueue<2097152UL> *)in_stack_fffffffffffffef8,
                             in_stack_fffffffffffffef0);
          in_stack_fffffffffffffe6a = bVar1 ^ 0xff;
        }
        if ((in_stack_fffffffffffffe6a & 1) == 0) break;
        local_124 = 100;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_120,&local_124);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffffea0);
      }
    }
    av_packet_unref(&stack0xfffffffffffffef8);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                     0x1115b3);
  if (bVar1) {
    PacketQueue<14680064UL>::setFinished(in_RDI);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                     0x1115d8);
  if (bVar1) {
    PacketQueue<2097152UL>::setFinished((PacketQueue<2097152UL> *)in_RDI);
  }
  bVar1 = std::thread::joinable((thread *)in_RDI);
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::thread::joinable((thread *)in_RDI);
  if (bVar1) {
    std::thread::join();
  }
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)__i);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,
             (mutex_type *)
             CONCAT17(__i,CONCAT43(in_stack_fffffffffffffe6b,
                                   CONCAT12(in_stack_fffffffffffffe6a,in_stack_fffffffffffffe68))));
  while (bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe78),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::condition_variable::wait((unique_lock *)&((PacketQueue<2097152UL> *)in_RDI)[7].field_0x38);
  }
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_RDI);
  SDL_PushEvent(&stack0xfffffffffffffe78);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  return 0;
}

Assistant:

int MovieState::parse_handler()
{
    auto &audio_queue = mAudio.mPackets;
    auto &video_queue = mVideo.mPackets;

    int video_index{-1};
    int audio_index{-1};

    /* Find the first video and audio streams */
    for(unsigned int i{0u};i < mFormatCtx->nb_streams;i++)
    {
        auto codecpar = mFormatCtx->streams[i]->codecpar;
        if(codecpar->codec_type == AVMEDIA_TYPE_VIDEO && !DisableVideo && video_index < 0)
            video_index = streamComponentOpen(i);
        else if(codecpar->codec_type == AVMEDIA_TYPE_AUDIO && audio_index < 0)
            audio_index = streamComponentOpen(i);
    }

    if(video_index < 0 && audio_index < 0)
    {
        std::cerr<< mFilename<<": could not open codecs" <<std::endl;
        mQuit = true;
    }

    /* Set the base time 750ms ahead of the current av time. */
    mClockBase = get_avtime() + milliseconds{750};

    if(audio_index >= 0)
        mAudioThread = std::thread{std::mem_fn(&AudioState::handler), &mAudio};
    if(video_index >= 0)
        mVideoThread = std::thread{std::mem_fn(&VideoState::handler), &mVideo};

    /* Main packet reading/dispatching loop */
    while(!mQuit.load(std::memory_order_relaxed))
    {
        AVPacket packet;
        if(av_read_frame(mFormatCtx.get(), &packet) < 0)
            break;

        /* Copy the packet into the queue it's meant for. */
        if(packet.stream_index == video_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !video_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }
        else if(packet.stream_index == audio_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !audio_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }

        av_packet_unref(&packet);
    }
    /* Finish the queues so the receivers know nothing more is coming. */
    if(mVideo.mCodecCtx) video_queue.setFinished();
    if(mAudio.mCodecCtx) audio_queue.setFinished();

    /* all done - wait for it */
    if(mVideoThread.joinable())
        mVideoThread.join();
    if(mAudioThread.joinable())
        mAudioThread.join();

    mVideo.mEOS = true;
    std::unique_lock<std::mutex> lock{mVideo.mPictQMutex};
    while(!mVideo.mFinalUpdate)
        mVideo.mPictQCond.wait(lock);
    lock.unlock();

    SDL_Event evt{};
    evt.user.type = FF_MOVIE_DONE_EVENT;
    SDL_PushEvent(&evt);

    return 0;
}